

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

opj_bool dwt_decode_real(opj_tcd_tilecomp_t *tilec,int numres)

{
  int x;
  OPJ_UINT32 OVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  v4 *pvVar5;
  opj_tcd_resolution_t *poVar6;
  OPJ_UINT32 in_ESI;
  int *in_RDI;
  int k_3;
  int k_2;
  int k_1;
  int k;
  int j;
  int bufsize;
  float *aj;
  int w;
  int rh;
  int rw;
  opj_tcd_resolution_t *res;
  v4dwt_t v;
  v4dwt_t h;
  int in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_68;
  int local_64;
  float *local_60;
  opj_tcd_resolution_t *local_48;
  v4 *dwt;
  OPJ_UINT32 local_c;
  
  local_48 = *(opj_tcd_resolution_t **)(in_RDI + 6);
  x = in_RDI[2] - *in_RDI;
  OVar1 = dwt_max_resolution(local_48,in_ESI);
  pvVar5 = (v4 *)malloc((ulong)(OVar1 + 5) << 4);
  dwt = pvVar5;
  local_c = in_ESI;
  do {
    local_c = local_c - 1;
    if (local_c == 0) {
      free(dwt);
      return 1;
    }
    local_60 = *(float **)(in_RDI + 8);
    local_64 = (in_RDI[2] - *in_RDI) * (in_RDI[3] - in_RDI[1]);
    poVar6 = local_48 + 1;
    uVar2 = local_48[1].x1 - poVar6->x0;
    uVar3 = local_48[1].y1 - local_48[1].y0;
    for (local_68 = uVar3; 3 < (int)local_68; local_68 = local_68 - 4) {
      v4dwt_interleave_h((v4dwt_t *)&stack0xffffffffffffffd8,local_60,x,local_64);
      v4dwt_decode((v4dwt_t *)dwt);
      in_stack_ffffffffffffff94 = uVar2;
      while (in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 - 1,
            -1 < (int)in_stack_ffffffffffffff94) {
        local_60[(int)in_stack_ffffffffffffff94] = dwt[(int)in_stack_ffffffffffffff94].f[0];
        local_60[(int)(in_stack_ffffffffffffff94 + x)] =
             dwt->f[(long)(int)in_stack_ffffffffffffff94 * 4 + 1];
        local_60[(int)(in_stack_ffffffffffffff94 + x * 2)] =
             dwt->f[(long)(int)in_stack_ffffffffffffff94 * 4 + 2];
        local_60[(int)(in_stack_ffffffffffffff94 + x * 3)] =
             dwt->f[(long)(int)in_stack_ffffffffffffff94 * 4 + 3];
      }
      local_60 = local_60 + x * 4;
      local_64 = local_64 + x * -4;
    }
    if ((uVar3 & 3) != 0) {
      uVar4 = uVar3 & 3;
      v4dwt_interleave_h((v4dwt_t *)&stack0xffffffffffffffd8,local_60,x,local_64);
      v4dwt_decode((v4dwt_t *)dwt);
      in_stack_ffffffffffffff90 = uVar2;
LAB_0015d0cf:
      in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 - 1;
      if (-1 < (int)in_stack_ffffffffffffff90) {
        in_stack_ffffffffffffff84 = uVar4;
        if (uVar4 != 1) {
          if (uVar4 != 2) break;
          goto LAB_0015d13b;
        }
        goto LAB_0015d166;
      }
    }
    local_60 = *(float **)(in_RDI + 8);
    for (local_68 = uVar2; 3 < (int)local_68; local_68 = local_68 - 4) {
      v4dwt_interleave_v((v4dwt_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (float *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      v4dwt_decode((v4dwt_t *)dwt);
      for (in_stack_ffffffffffffff8c = 0; in_stack_ffffffffffffff8c < (int)uVar3;
          in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1) {
        *(undefined8 *)((long)local_60 + (long)(in_stack_ffffffffffffff8c * x) * 4) =
             *(undefined8 *)(pvVar5 + in_stack_ffffffffffffff8c);
        *(undefined8 *)((long)local_60 + 8 + (long)(in_stack_ffffffffffffff8c * x) * 4) =
             *(undefined8 *)(pvVar5[in_stack_ffffffffffffff8c].f + 2);
      }
      local_60 = (float *)((long)local_60 + 0x10);
    }
    local_48 = poVar6;
    if ((uVar2 & 3) != 0) {
      v4dwt_interleave_v((v4dwt_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (float *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      v4dwt_decode((v4dwt_t *)dwt);
      for (in_stack_ffffffffffffff88 = 0; in_stack_ffffffffffffff88 < (int)uVar3;
          in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1) {
        memcpy((void *)((long)local_60 + (long)(in_stack_ffffffffffffff88 * x) * 4),
               pvVar5 + in_stack_ffffffffffffff88,(long)(int)(uVar2 & 3) << 2);
      }
    }
  } while( true );
  if (uVar4 == 3) {
    local_60[(int)(in_stack_ffffffffffffff90 + x * 2)] =
         dwt->f[(long)(int)in_stack_ffffffffffffff90 * 4 + 2];
LAB_0015d13b:
    local_60[(int)(in_stack_ffffffffffffff90 + x)] =
         dwt->f[(long)(int)in_stack_ffffffffffffff90 * 4 + 1];
LAB_0015d166:
    local_60[(int)in_stack_ffffffffffffff90] = dwt[(int)in_stack_ffffffffffffff90].f[0];
  }
  goto LAB_0015d0cf;
}

Assistant:

opj_bool dwt_decode_real(opj_tcd_tilecomp_t* restrict tilec, int numres){
	v4dwt_t h;
	v4dwt_t v;

	opj_tcd_resolution_t* res = tilec->resolutions;

	int rw = res->x1 - res->x0;	/* width of the resolution level computed */
	int rh = res->y1 - res->y0;	/* height of the resolution level computed */

	int w = tilec->x1 - tilec->x0;

	h.wavelet = (v4*) opj_aligned_malloc((dwt_max_resolution(res, numres)+5) * sizeof(v4));
	v.wavelet = h.wavelet;

	while( --numres) {
		float * restrict aj = (float*) tilec->data;
		int bufsize = (tilec->x1 - tilec->x0) * (tilec->y1 - tilec->y0);
		int j;

		h.sn = rw;
		v.sn = rh;

		++res;

		rw = res->x1 - res->x0;	/* width of the resolution level computed */
		rh = res->y1 - res->y0;	/* height of the resolution level computed */

		h.dn = rw - h.sn;
		h.cas = res->x0 % 2;

		for(j = rh; j > 3; j -= 4){
			int k;
			v4dwt_interleave_h(&h, aj, w, bufsize);
			v4dwt_decode(&h);
				for(k = rw; --k >= 0;){
					aj[k    ] = h.wavelet[k].f[0];
					aj[k+w  ] = h.wavelet[k].f[1];
					aj[k+w*2] = h.wavelet[k].f[2];
					aj[k+w*3] = h.wavelet[k].f[3];
				}
			aj += w*4;
			bufsize -= w*4;
		}
		if (rh & 0x03) {
				int k;
			j = rh & 0x03;
			v4dwt_interleave_h(&h, aj, w, bufsize);
			v4dwt_decode(&h);
				for(k = rw; --k >= 0;){
					switch(j) {
						case 3: aj[k+w*2] = h.wavelet[k].f[2];
						case 2: aj[k+w  ] = h.wavelet[k].f[1];
						case 1: aj[k    ] = h.wavelet[k].f[0];
					}
				}
			}

		v.dn = rh - v.sn;
		v.cas = res->y0 % 2;

		aj = (float*) tilec->data;
		for(j = rw; j > 3; j -= 4){
			int k;
			v4dwt_interleave_v(&v, aj, w, 4);
			v4dwt_decode(&v);
				for(k = 0; k < rh; ++k){
					memcpy(&aj[k*w], &v.wavelet[k], 4 * sizeof(float));
				}
			aj += 4;
		}
		if (rw & 0x03){
				int k;
			j = rw & 0x03;
			v4dwt_interleave_v(&v, aj, w, j);
			v4dwt_decode(&v);
				for(k = 0; k < rh; ++k){
					memcpy(&aj[k*w], &v.wavelet[k], j * sizeof(float));
				}
			}
	}

	opj_aligned_free(h.wavelet);
	return OPJ_TRUE;
}